

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O1

int sp_dgemv(char *trans,double alpha,SuperMatrix *A,double *x,int incx,double beta,double *y,
            int incy)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  undefined8 uVar8;
  double *pdVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  int info;
  char msg [256];
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  ulong local_148;
  double local_140;
  char local_138 [264];
  
  bVar1 = *trans;
  pvVar4 = A->Store;
  lVar5 = *(long *)((long)pvVar4 + 8);
  local_158 = 0;
  if ((bVar1 - 0x43 < 0x2c) && ((0x80000020801U >> ((ulong)(bVar1 - 0x43) & 0x3f) & 1) != 0)) {
    if ((A->nrow < 0) || (A->ncol < 0)) {
      local_158 = 3;
    }
    else if (incx == 0) {
      local_158 = 5;
    }
    else if (incy == 0) {
      local_158 = 8;
    }
  }
  else {
    local_158 = 1;
  }
  if (local_158 == 0) {
    uVar2 = A->nrow;
    if (uVar2 != 0) {
      uVar3 = A->ncol;
      uVar15 = (ulong)uVar3;
      if ((uVar15 != 0) && ((((alpha != 0.0 || (NAN(alpha))) || (beta != 1.0)) || (NAN(beta))))) {
        uVar6 = uVar2;
        if (bVar1 != 0x4e) {
          uVar6 = uVar3;
          uVar3 = uVar2;
        }
        iVar13 = (1 - uVar3) * incx;
        if (0 < incx) {
          iVar13 = 0;
        }
        iVar11 = (1 - uVar6) * incy;
        if (0 < incy) {
          iVar11 = 0;
        }
        if ((beta != 1.0) || (NAN(beta))) {
          if (incy == 1) {
            if ((beta != 0.0) || (NAN(beta))) {
              if (0 < (int)uVar6) {
                uVar10 = 0;
                do {
                  y[uVar10] = y[uVar10] * beta;
                  uVar10 = uVar10 + 1;
                } while (uVar6 != uVar10);
              }
            }
            else if (0 < (int)uVar6) {
              local_154 = iVar13;
              local_150 = iVar11;
              local_14c = incy;
              local_148 = uVar15;
              local_140 = alpha;
              memset(y,0,(ulong)uVar6 << 3);
              uVar15 = local_148;
              alpha = local_140;
              iVar13 = local_154;
              iVar11 = local_150;
              incy = local_14c;
            }
          }
          else if ((beta != 0.0) || (NAN(beta))) {
            if (0 < (int)uVar6) {
              pdVar9 = y + iVar11;
              do {
                *pdVar9 = *pdVar9 * beta;
                pdVar9 = pdVar9 + incy;
                uVar6 = uVar6 - 1;
              } while (uVar6 != 0);
            }
          }
          else if (0 < (int)uVar6) {
            pdVar9 = y + iVar11;
            do {
              *pdVar9 = 0.0;
              pdVar9 = pdVar9 + incy;
              uVar6 = uVar6 - 1;
            } while (uVar6 != 0);
          }
        }
        if ((alpha != 0.0) || (NAN(alpha))) {
          if ((bVar1 | 0x20) == 0x6e) {
            if (incy == 1) {
              if ((int)uVar15 < 1) {
                return 0;
              }
              lVar7 = (long)iVar13;
              uVar10 = 0;
              do {
                dVar16 = x[lVar7];
                if ((dVar16 != 0.0) || (NAN(dVar16))) {
                  iVar13 = *(int *)(*(long *)((long)pvVar4 + 0x18) + uVar10 * 4);
                  lVar12 = (long)iVar13;
                  iVar11 = *(int *)(*(long *)((long)pvVar4 + 0x18) + 4 + uVar10 * 4);
                  if (iVar13 < iVar11) {
                    lVar14 = *(long *)((long)pvVar4 + 0x10);
                    do {
                      iVar13 = *(int *)(lVar14 + lVar12 * 4);
                      y[iVar13] = *(double *)(lVar5 + lVar12 * 8) * dVar16 * alpha + y[iVar13];
                      lVar12 = lVar12 + 1;
                    } while (iVar11 != lVar12);
                  }
                }
                lVar7 = lVar7 + incx;
                uVar10 = uVar10 + 1;
              } while (uVar10 != uVar15);
              return 0;
            }
            uVar8 = 0x1ce;
          }
          else {
            if (incx == 1) {
              if ((int)uVar15 < 1) {
                return 0;
              }
              lVar7 = *(long *)((long)pvVar4 + 0x18);
              lVar12 = (long)iVar11;
              uVar10 = 0;
              do {
                iVar13 = *(int *)(lVar7 + uVar10 * 4);
                lVar14 = (long)iVar13;
                iVar11 = *(int *)(lVar7 + 4 + uVar10 * 4);
                dVar16 = 0.0;
                if (iVar13 < iVar11) {
                  do {
                    dVar16 = dVar16 + *(double *)(lVar5 + lVar14 * 8) *
                                      x[*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar14 * 4)];
                    lVar14 = lVar14 + 1;
                  } while (iVar11 != lVar14);
                }
                uVar10 = uVar10 + 1;
                y[lVar12] = dVar16 * alpha + y[lVar12];
                lVar12 = lVar12 + incy;
              } while (uVar10 != uVar15);
              return 0;
            }
            uVar8 = 0x1de;
          }
          sprintf(local_138,"%s at line %d in file %s\n","Not implemented.",uVar8,
                  "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c"
                 );
          superlu_abort_and_exit(local_138);
        }
      }
    }
  }
  else {
    input_error("sp_dgemv ",&local_158);
  }
  return 0;
}

Assistant:

int
sp_dgemv(char *trans, double alpha, SuperMatrix *A, double *x, 
	 int incx, double beta, double *y, int incy)
{
    /* Local variables */
    NCformat *Astore;
    double   *Aval;
    int info;
    double temp;
    int lenx, leny;
    int iy, jx, jy, kx, ky, irow;
    int_t i, j;
    int notran;

    notran = ( strncmp(trans, "N", 1)==0 || strncmp(trans, "n", 1)==0 );
    Astore = A->Store;
    Aval = Astore->nzval;
    
    /* Test the input parameters */
    info = 0;
    if ( !notran && strncmp(trans, "T", 1)!=0 && strncmp(trans, "C", 1)!=0 )
        info = 1;
    else if ( A->nrow < 0 || A->ncol < 0 ) info = 3;
    else if (incx == 0) info = 5;
    else if (incy == 0)	info = 8;
    if (info != 0) {
	input_error("sp_dgemv ", &info);
	return 0;
    }

    /* Quick return if possible. */
    if (A->nrow == 0 || A->ncol == 0 || (alpha == 0. && beta == 1.))
	return 0;

    /* Set  LENX  and  LENY, the lengths of the vectors x and y, and set 
       up the start points in  X  and  Y. */
    if (strncmp(trans, "N", 1)==0) {
	lenx = A->ncol;
	leny = A->nrow;
    } else {
	lenx = A->nrow;
	leny = A->ncol;
    }
    if (incx > 0) kx = 0;
    else kx =  - (lenx - 1) * incx;
    if (incy > 0) ky = 0;
    else ky =  - (leny - 1) * incy;

    /* Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through A. */
    /* First form  y := beta*y. */
    if (beta != 1.) {
	if (incy == 1) {
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) y[i] = 0.;
	    else
		for (i = 0; i < leny; ++i) y[i] = beta * y[i];
	} else {
	    iy = ky;
	    if (beta == 0.)
		for (i = 0; i < leny; ++i) {
		    y[iy] = 0.;
		    iy += incy;
		}
	    else
		for (i = 0; i < leny; ++i) {
		    y[iy] = beta * y[iy];
		    iy += incy;
		}
	}
    }
    
    if (alpha == 0.) return 0;

    if ( notran ) {
	/* Form  y := alpha*A*x + y. */
	jx = kx;
	if (incy == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		if (x[jx] != 0.) {
		    temp = alpha * x[jx];
		    for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
			irow = Astore->rowind[i];
			y[irow] += temp * Aval[i];
		    }
		}
		jx += incx;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    } else {
	/* Form  y := alpha*A'*x + y. */
	jy = ky;
	if (incx == 1) {
	    for (j = 0; j < A->ncol; ++j) {
		temp = 0.;
		for (i = Astore->colptr[j]; i < Astore->colptr[j+1]; ++i) {
		    irow = Astore->rowind[i];
		    temp += Aval[i] * x[irow];
		}
		y[jy] += alpha * temp;
		jy += incy;
	    }
	} else {
	    ABORT("Not implemented.");
	}
    }

    return 0;
}